

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iomapper.cpp
# Opt level: O2

void __thiscall
glslang::TSymbolValidater::TSymbolValidater
          (TSymbolValidater *this,TIoMapResolver *r,TInfoSink *i,TVarLiveMap **in,TVarLiveMap **out,
          TVarLiveMap **uniform,bool *hadError,EProfile profile,int version)

{
  TVarLiveMap *pTVar1;
  pointer pTVar2;
  allocator_type __s;
  TIntermSymbol *pTVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  TTypeList *pTVar6;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *pbVar7;
  iterator iVar8;
  mapped_type *pmVar9;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  _Rb_tree_node_base *p_Var10;
  long lVar11;
  long lVar12;
  uint uVar13;
  char *__lhs;
  TSymbolValidater *pTVar14;
  TVarLiveMap **ppTVar15;
  size_t memberIdx;
  ulong uVar16;
  bool diffLocation;
  TSymbolValidater *local_1e8;
  pool_allocator<char> local_1e0;
  TRange locationRange;
  TString err_2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
  usedUniformName;
  vector<glslang::TRange,_std::allocator<glslang::TRange>_> usedUniformLocation;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
  anonymousMemberMap;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
  uniformVar;
  TString err;
  string local_a0;
  TString symbolName;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_58;
  
  this->resolver = r;
  this->infoSink = i;
  this->hadError = hadError;
  this->profile = profile;
  this->version = version;
  lVar12 = 0xe;
  pTVar14 = this;
  for (lVar11 = lVar12; lVar11 != 0; lVar11 = lVar11 + -1) {
    pTVar14->inVarMaps[0] = *in;
    in = in + 1;
    pTVar14 = (TSymbolValidater *)(pTVar14->inVarMaps + 1);
  }
  ppTVar15 = this->outVarMaps;
  for (lVar11 = lVar12; lVar11 != 0; lVar11 = lVar11 + -1) {
    *ppTVar15 = *out;
    out = out + 1;
    ppTVar15 = ppTVar15 + 1;
  }
  ppTVar15 = this->uniformVarMap;
  for (; lVar12 != 0; lVar12 = lVar12 + -1) {
    *ppTVar15 = *uniform;
    uniform = uniform + 1;
    ppTVar15 = ppTVar15 + 1;
  }
  anonymousMemberMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &anonymousMemberMap._M_t._M_impl.super__Rb_tree_header._M_header;
  anonymousMemberMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  anonymousMemberMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  anonymousMemberMap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  usedUniformLocation.super__Vector_base<glslang::TRange,_std::allocator<glslang::TRange>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  usedUniformLocation.super__Vector_base<glslang::TRange,_std::allocator<glslang::TRange>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  usedUniformLocation.super__Vector_base<glslang::TRange,_std::allocator<glslang::TRange>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  usedUniformName.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  usedUniformName.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  usedUniformName.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar12 = 0;
  local_1e8 = this;
  anonymousMemberMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       anonymousMemberMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if (lVar12 == 0xe) {
      std::
      _Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
      ::~_Vector_base(&usedUniformName.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
                     );
      std::_Vector_base<glslang::TRange,_std::allocator<glslang::TRange>_>::~_Vector_base
                (&usedUniformLocation.
                  super__Vector_base<glslang::TRange,_std::allocator<glslang::TRange>_>);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
      ::~_Rb_tree(&anonymousMemberMap._M_t);
      return;
    }
    pTVar1 = this->uniformVarMap[lVar12];
    if (pTVar1 != (TVarLiveMap *)0x0) {
      for (p_Var10 = (pTVar1->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var10 != &(pTVar1->_M_t)._M_impl.super__Rb_tree_header;
          p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10)) {
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
        ::pair(&uniformVar,
               (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
                *)(p_Var10 + 1));
        pTVar3 = uniformVar.second.symbol;
        iVar5 = (*((uniformVar.second.symbol)->super_TIntermTyped).super_TIntermNode.
                  _vptr_TIntermNode[0x21])(uniformVar.second.symbol);
        uVar13 = *(uint *)(CONCAT44(extraout_var,iVar5) + 0x1c) & 0xfff;
        iVar5 = (*(pTVar3->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x34])(pTVar3);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        basic_string(&symbolName,
                     (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                     CONCAT44(extraout_var_00,iVar5));
        if (uVar13 != 0xfff) {
          iVar5 = (*(pTVar3->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(pTVar3);
          iVar5 = TIntermediate::computeTypeUniformLocationSize
                            ((TType *)CONCAT44(extraout_var_01,iVar5));
          locationRange.last = iVar5 + uVar13 + -1;
          diffLocation = false;
          locationRange.start = uVar13;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          basic_string(&local_58,&symbolName);
          iVar5 = checkLocationOverlap
                            (local_1e8,&locationRange,&usedUniformLocation,&local_58,
                             &usedUniformName,&diffLocation);
          if (iVar5 == -1) {
            std::vector<glslang::TRange,_std::allocator<glslang::TRange>_>::push_back
                      (&usedUniformLocation,&locationRange);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
            ::push_back(&usedUniformName,&symbolName);
          }
          else if (-1 < iVar5) {
            if (diffLocation == true) {
              std::__cxx11::to_string(&local_a0,iVar5);
              __lhs = "Uniform location should be equal for same uniforms: ";
            }
            else {
              std::__cxx11::to_string(&local_a0,iVar5);
              __lhs = "Uniform location overlaps across stages: ";
            }
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &err_2,__lhs,&local_a0);
            __s = err_2._M_dataplus.super_allocator_type;
            local_1e0.allocator = GetThreadPoolAllocator();
            std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
            basic_string<glslang::std::allocator<char>>
                      ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                       &err,(char *)__s.allocator,&local_1e0);
            std::__cxx11::string::_M_dispose();
            std::__cxx11::string::_M_dispose();
            TInfoSinkBase::message
                      (&local_1e8->infoSink->info,EPrefixInternalError,err._M_dataplus._M_p);
            *hadError = true;
            break;
          }
        }
        iVar5 = (*((uniformVar.second.symbol)->super_TIntermTyped).super_TIntermNode.
                  _vptr_TIntermNode[0x20])();
        if (iVar5 == 0x10) {
          iVar5 = (*((uniformVar.second.symbol)->super_TIntermTyped).super_TIntermNode.
                    _vptr_TIntermNode[0x32])();
          bVar4 = IsAnonymous((TString *)CONCAT44(extraout_var_02,iVar5));
          if (bVar4) {
            iVar5 = (*((uniformVar.second.symbol)->super_TIntermTyped).super_TIntermNode.
                      _vptr_TIntermNode[0x1e])();
            pTVar6 = TType::getStruct((TType *)CONCAT44(extraout_var_03,iVar5));
            lVar11 = 0;
            uVar16 = 0;
            while( true ) {
              pTVar2 = (pTVar6->
                       super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>)
                       .
                       super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              if ((ulong)((long)(pTVar6->
                                super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                ).
                                super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar2 >> 5) <=
                  uVar16) break;
              pbVar7 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *
                       )(**(code **)(**(long **)((long)&pTVar2->type + lVar11) + 0x30))();
              std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
              basic_string(&err,pbVar7);
              iVar8 = std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
                      ::find(&anonymousMemberMap._M_t,&err);
              if ((_Rb_tree_header *)iVar8._M_node ==
                  &anonymousMemberMap._M_t._M_impl.super__Rb_tree_header) {
                iVar5 = (*((uniformVar.second.symbol)->super_TIntermTyped).super_TIntermNode.
                          _vptr_TIntermNode[0x1e])();
                pbVar7 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                          *)(**(code **)(*(long *)CONCAT44(extraout_var_05,iVar5) + 0x28))
                                      ((long *)CONCAT44(extraout_var_05,iVar5));
                pmVar9 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
                         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
                                       *)&anonymousMemberMap._M_t,&err);
                std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                _M_assign(pmVar9,pbVar7);
              }
              else {
                pmVar9 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
                         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
                                       *)&anonymousMemberMap._M_t,&err);
                iVar5 = (*((uniformVar.second.symbol)->super_TIntermTyped).super_TIntermNode.
                          _vptr_TIntermNode[0x1e])();
                pbVar7 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                          *)(**(code **)(*(long *)CONCAT44(extraout_var_04,iVar5) + 0x28))
                                      ((long *)CONCAT44(extraout_var_04,iVar5));
                bVar4 = std::operator!=(pmVar9,pbVar7);
                if (bVar4) {
                  std::operator+(&err_2,"Invalid block member name: ",&err);
                  TInfoSinkBase::message
                            (&local_1e8->infoSink->info,EPrefixInternalError,err_2._M_dataplus._M_p)
                  ;
                  *hadError = true;
                  break;
                }
              }
              uVar16 = uVar16 + 1;
              lVar11 = lVar11 + 0x20;
            }
          }
        }
        if (*hadError == true) break;
      }
    }
    lVar12 = lVar12 + 1;
  } while( true );
}

Assistant:

TSymbolValidater(TIoMapResolver& r, TInfoSink& i, TVarLiveMap* in[EShLangCount], TVarLiveMap* out[EShLangCount],
                     TVarLiveMap* uniform[EShLangCount], bool& hadError, EProfile profile, int version)
        : resolver(r)
        , infoSink(i)
        , hadError(hadError)
        , profile(profile)
        , version(version)
    {
        memcpy(inVarMaps, in, EShLangCount * (sizeof(TVarLiveMap*)));
        memcpy(outVarMaps, out, EShLangCount * (sizeof(TVarLiveMap*)));
        memcpy(uniformVarMap, uniform, EShLangCount * (sizeof(TVarLiveMap*)));

        std::map<TString, TString> anonymousMemberMap;
        std::vector<TRange> usedUniformLocation;
        std::vector<TString> usedUniformName;
        usedUniformLocation.clear();
        usedUniformName.clear();
        for (int i = 0; i < EShLangCount; i++) {
            if (uniformVarMap[i]) {
                for (auto uniformVar : *uniformVarMap[i])
                {
                    TIntermSymbol* pSymbol = uniformVar.second.symbol;
                    TQualifier qualifier = uniformVar.second.symbol->getQualifier();
                    TString symbolName = pSymbol->getAccessName();

                    // All the uniform needs multi-stage location check (block/default)
                    int uniformLocation = qualifier.layoutLocation;

                    if (uniformLocation != TQualifier::layoutLocationEnd) {
                        // Total size of current uniform, could be block, struct or other types.
                        int size = TIntermediate::computeTypeUniformLocationSize(pSymbol->getType());

                        TRange locationRange(uniformLocation, uniformLocation + size - 1);

                        // Combine location and component ranges
                        int overlapLocation = -1;
                        bool diffLocation = false;

                        // Check for collisions, except for vertex inputs on desktop targeting OpenGL
                        overlapLocation = checkLocationOverlap(locationRange, usedUniformLocation, symbolName, usedUniformName, diffLocation);

                        // Overlap locations of uniforms, regardless of components (multi stages)
                        if (overlapLocation == -1) {
                            usedUniformLocation.push_back(locationRange);
                            usedUniformName.push_back(symbolName);
                        }
                        else if (overlapLocation >= 0) {
                            if (diffLocation == true) {
                                TString err = ("Uniform location should be equal for same uniforms: " +std::to_string(overlapLocation)).c_str();
                                infoSink.info.message(EPrefixInternalError, err.c_str());
                                hadError = true;
                                break;
                            }
                            else {
                                TString err = ("Uniform location overlaps across stages: " + std::to_string(overlapLocation)).c_str();
                                infoSink.info.message(EPrefixInternalError, err.c_str());
                                hadError = true;
                                break;
                            }
                        }
                    }

                    if ((uniformVar.second.symbol->getBasicType() == EbtBlock) &&
                        IsAnonymous(uniformVar.second.symbol->getName()))
                    {
                        auto blockType = uniformVar.second.symbol->getType().getStruct();
                        for (size_t memberIdx = 0; memberIdx < blockType->size(); ++memberIdx) {
                            auto memberName = (*blockType)[memberIdx].type->getFieldName();
                            if (anonymousMemberMap.find(memberName) != anonymousMemberMap.end())
                            {
                                if (anonymousMemberMap[memberName] != uniformVar.second.symbol->getType().getTypeName())
                                {
                                    TString err = "Invalid block member name: " + memberName;
                                    infoSink.info.message(EPrefixInternalError, err.c_str());
                                    hadError = true;
                                    break;
                                }
                            }
                            else
                            {
                                anonymousMemberMap[memberName] = uniformVar.second.symbol->getType().getTypeName();
                            }
                        }
                    }
                    if (hadError)
                        break;
                }
            }
        }
    }